

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O3

string * tinyusdz::value::print_strided_array_snipped<tinyusdz::value::half>
                   (string *__return_storage_ptr__,uint8_t *vals,size_t stride_bytes,size_t n,
                   size_t N)

{
  ulong uVar1;
  half *phVar2;
  size_t i;
  ulong uVar3;
  size_t sVar4;
  stringstream os;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if ((stride_bytes & 0xfffffffffffffffd) == 0) {
    print_array_snipped<tinyusdz::value::half>(__return_storage_ptr__,(half *)vals,n,N);
  }
  else {
    if (N == 0 || n <= N * 2) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      if (n != 0) {
        sVar4 = 0;
        do {
          if (sVar4 != 0) {
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
          }
          ::std::operator<<(local_1a8,(half *)vals);
          sVar4 = sVar4 + 1;
          vals = (uint8_t *)((long)&((half *)vals)->value + stride_bytes);
        } while (n != sVar4);
      }
    }
    else {
      uVar1 = n - N;
      if (n < N) {
        N = n;
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      uVar3 = 0;
      phVar2 = (half *)vals;
      do {
        if (uVar3 != 0) {
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
        }
        ::std::operator<<(local_1a8,phVar2);
        uVar3 = uVar3 + 1;
        phVar2 = (half *)((long)&phVar2->value + stride_bytes);
      } while (N != uVar3);
      if (N < uVar1) {
        N = uVar1;
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ..., ",7);
      if (N < n) {
        phVar2 = (half *)(vals + stride_bytes * N);
        uVar1 = N;
        do {
          if (N < uVar1) {
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
          }
          ::std::operator<<(local_1a8,phVar2);
          uVar1 = uVar1 + 1;
          phVar2 = (half *)((long)&phVar2->value + stride_bytes);
        } while (n != uVar1);
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
    ::std::__cxx11::stringbuf::str();
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_strided_array_snipped(const uint8_t *vals, size_t stride_bytes, const size_t n, size_t N = 16) {
  std::stringstream os;

  if ((stride_bytes == 0) || (stride_bytes == sizeof(T))) { // tightly packed.
    return print_array_snipped(reinterpret_cast<const T*>(vals), n, N);
  }

  if ((N == 0) || ((N * 2) >= n)) {
    os << "[";
    for (size_t i = 0; i < n; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << *reinterpret_cast<const T *>(&vals[i * stride_bytes]);
    }
    os << "]";
  } else {
    size_t head_end = (std::min)(N, n);
    size_t tail_start = (std::max)(n - N, head_end);

    os << "[";

    for (size_t i = 0; i < head_end; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << *reinterpret_cast<const T *>(&vals[i * stride_bytes]);
    }

    os << ", ..., ";

    for (size_t i = tail_start; i < n; i++) {
      if (i > tail_start) {
        os << ", ";
      }
      os << *reinterpret_cast<const T *>(&vals[i * stride_bytes]);
    }

    os << "]";
  }
  return os.str();
}